

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_FindSupportMin(sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSuppStart
                  )

{
  Vec_Int_t *vSupp;
  Vec_Int_t *pVVar1;
  int iVar;
  
  vSupp = Vec_IntDup(vSuppStart);
  iVar = vSupp->nSize;
  do {
    if (iVar < 1) {
      return vSupp;
    }
    iVar = iVar + -1;
    pVVar1 = Acb_FindSupportMinOne(pSat,iFirstDiv,vPats,pnPats,vSupp,iVar);
    if (vSupp != pVVar1) {
      Vec_IntFree(vSupp);
    }
    vSupp = pVVar1;
  } while (pVVar1 != (Vec_Int_t *)0x0);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Acb_FindSupportMin( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSuppStart )
{
    Vec_Int_t * vTemp, * vSupp = Vec_IntDup( vSuppStart ); int i;
    for ( i = Vec_IntSize(vSupp)-1; i >= 0; i-- )
    {
        vSupp = Acb_FindSupportMinOne( pSat, iFirstDiv, vPats, pnPats, vTemp = vSupp, i );
        if ( vTemp != vSupp )
            Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            return NULL;
    }
    return vSupp;
}